

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

bool __thiscall spvtools::Optimizer::FlagHasValidForm(Optimizer *this,string *flag)

{
  bool bVar1;
  ulong uVar2;
  MessageConsumer *consumer;
  bool local_71;
  char *local_68;
  spv_position_t local_60;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *flag_local;
  Optimizer *this_local;
  
  local_20 = flag;
  flag_local = (string *)this;
  bVar1 = std::operator==(flag,"-O");
  if ((bVar1) || (bVar1 = std::operator==(local_20,"-Os"), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    uVar2 = std::__cxx11::string::size();
    local_41 = 0;
    local_71 = false;
    if (2 < uVar2) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)local_20);
      local_41 = 1;
      local_71 = std::operator==(&local_40,"--");
    }
    if ((local_41 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (local_71 == false) {
      consumer = Optimizer::consumer(this);
      memset(&local_60,0,0x18);
      local_68 = (char *)std::__cxx11::string::c_str();
      Errorf<char_const*>(consumer,(char *)0x0,&local_60,
                          "%s is not a valid flag.  Flag passes should have the form \'--pass_name[=pass_args]\'. Special flag names also accepted: -O and -Os."
                          ,&local_68);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Optimizer::FlagHasValidForm(const std::string& flag) const {
  if (flag == "-O" || flag == "-Os") {
    return true;
  } else if (flag.size() > 2 && flag.substr(0, 2) == "--") {
    return true;
  }

  Errorf(consumer(), nullptr, {},
         "%s is not a valid flag.  Flag passes should have the form "
         "'--pass_name[=pass_args]'. Special flag names also accepted: -O "
         "and -Os.",
         flag.c_str());
  return false;
}